

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_12.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
Game::getGuessedNumbers(vector<int,_std::allocator<int>_> *__return_storage_ptr__,Game *this)

{
  iterator __position;
  bool bVar1;
  Game *this_00;
  int i;
  long lVar2;
  string input;
  int local_54;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  this_00 = (Game *)__return_storage_ptr__;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  while( true ) {
    bVar1 = isInputValid(this_00,&local_50);
    if (bVar1) break;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Enter 4 numbers from 0 to 9:\n",0x1d);
    this_00 = (Game *)&std::cin;
    std::operator>>((istream *)&std::cin,(string *)&local_50);
  }
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve(__return_storage_ptr__,4);
  lVar2 = 0;
  do {
    local_54 = local_50._M_dataplus._M_p[lVar2] + -0x30;
    __position._M_current =
         (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (__return_storage_ptr__,__position,&local_54);
    }
    else {
      *__position._M_current = local_54;
      (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    lVar2 = lVar2 + 1;
  } while (lVar2 != 4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> Game::getGuessedNumbers()
{
	std::string input{};
	while (not isInputValid(input))
	{
		std::cout << "Enter 4 numbers from 0 to 9:\n";
		std::cin >> input;
	}
	std::vector<int32_t> guessedNumbers;
	guessedNumbers.reserve(length);
	for (auto i = 0; i < length; ++i)
		guessedNumbers.push_back(input[i] - '0');
	return guessedNumbers;
}